

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

void __thiscall RVO::Agent::computeNewVelocity(Agent *this)

{
  vector<RVO::Line,_std::allocator<RVO::Line>_> *this_00;
  pointer *ppLVar1;
  Vector2 VVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  pointer ppVar9;
  pointer ppVar10;
  size_t beginLine;
  pointer ppVar11;
  float *pfVar12;
  pointer pLVar13;
  Obstacle *pOVar14;
  iterator iVar15;
  long lVar16;
  ulong uVar17;
  Obstacle *pOVar18;
  pointer pLVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [4];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  Line line;
  Line local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [4];
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_7c;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pLVar13 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar13) {
    (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar13;
  }
  this_00 = &this->orcaLines_;
  ppVar9 = (this->obstacleNeighbors_).
           super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar11 = (this->obstacleNeighbors_).
            super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pLVar19 = pLVar13;
  if (ppVar11 != ppVar9) {
    local_58 = 1.0 / this->timeHorizonObst_;
    local_48 = -local_58;
    fStack_44 = -0.0;
    fStack_40 = -0.0;
    fStack_3c = -0.0;
    _local_a8 = ZEXT416((uint)local_58);
    uVar17 = 0;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      pOVar18 = ppVar9[uVar17].second;
      pOVar14 = pOVar18->nextObstacle_;
      fVar29 = (pOVar18->point_).x_;
      fVar28 = (this->position_).x_;
      fVar20 = fVar29 - fVar28;
      auVar4 = ZEXT416((uint)fVar20);
      fVar27 = (pOVar18->point_).y_;
      fVar24 = (this->position_).y_;
      fVar21 = fVar27 - fVar24;
      _local_b8 = ZEXT416((uint)fVar21);
      fVar25 = (pOVar14->point_).x_;
      fVar22 = (pOVar14->point_).y_;
      fVar28 = fVar25 - fVar28;
      auVar6 = ZEXT416((uint)fVar28);
      fVar24 = fVar22 - fVar24;
      auVar5 = ZEXT416((uint)fVar24);
      pLVar13 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl
                .super__Vector_impl_data._M_start;
      iVar15._M_current =
           (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
           super__Vector_impl_data._M_finish;
      fVar23 = this->radius_;
      lVar16 = (long)iVar15._M_current - (long)pLVar13;
      local_e8 = auVar4;
      _local_d8 = auVar5;
      _local_c8 = auVar6;
      if (lVar16 != 0) {
        lVar16 = lVar16 >> 4;
        lVar16 = lVar16 + (ulong)(lVar16 == 0);
        pfVar12 = &(pLVar13->direction).y_;
        do {
          if ((-1e-05 <= (((float)local_a8._0_4_ * fVar20 - pfVar12[-3]) * *pfVar12 -
                         ((float)local_a8._0_4_ * fVar21 - pfVar12[-2]) *
                         ((Vector2 *)(pfVar12 + -1))->x_) + local_48 * fVar23) &&
             (-1e-05 <= local_48 * fVar23 +
                        (((float)local_a8._0_4_ * fVar28 - pfVar12[-3]) * *pfVar12 -
                        ((Vector2 *)(pfVar12 + -1))->x_ *
                        ((float)local_a8._0_4_ * fVar24 - pfVar12[-2])))) goto LAB_00107e13;
          pfVar12 = pfVar12 + 4;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      local_e8._4_4_ = 0.0;
      fVar31 = fVar20 * fVar20 + fVar21 * fVar21;
      fVar35 = fVar23 * fVar23;
      fVar25 = fVar25 - fVar29;
      fVar22 = fVar22 - fVar27;
      local_d8._0_4_ = -fVar20;
      fVar29 = -fVar21;
      fVar27 = ((float)local_d8._0_4_ * fVar25 - fVar22 * fVar21) /
               (fVar25 * fVar25 + fVar22 * fVar22);
      local_f8.point.x_ = 0.0;
      local_f8.point.y_ = 0.0;
      local_f8.direction.x_ = 0.0;
      local_f8.direction.y_ = 0.0;
      if ((0.0 <= fVar27) || (fVar35 < fVar31)) {
        fStack_c4 = 0.0;
        fStack_c0 = 0.0;
        fStack_bc = 0.0;
        fVar20 = fVar28 * fVar28 + fVar24 * fVar24;
        if ((1.0 < fVar27) && (fVar20 <= fVar35)) {
          if ((pOVar14->isConvex_ != true) ||
             ((pOVar14->unitDir_).y_ * fVar28 - (pOVar14->unitDir_).x_ * fVar24 < 0.0))
          goto LAB_00107e0b;
          local_f8.direction.y_ = fVar28 * (1.0 / SQRT(fVar20));
          local_f8.direction.x_ = -fVar24 * (1.0 / SQRT(fVar20));
          goto LAB_00107c16;
        }
        fVar24 = (float)local_d8._0_4_ - fVar25 * fVar27;
        fVar28 = fVar29 - fVar22 * fVar27;
        fVar28 = fVar24 * fVar24 + fVar28 * fVar28;
        if (((0.0 <= fVar27) && (fVar27 < 1.0)) && (fVar28 <= fVar35)) {
          local_f8.direction = (Vector2)((ulong)pOVar18->unitDir_ ^ 0x8000000080000000);
          goto LAB_00107c16;
        }
        if ((0.0 <= fVar27) || (fVar35 < fVar28)) {
          if ((fVar27 <= 1.0) || (fVar35 < fVar28)) {
            fVar28 = fStack_c4;
            fVar27 = fStack_c0;
            fVar24 = fStack_bc;
            if (pOVar18->isConvex_ == true) {
              fVar25 = fVar31 - fVar35;
              if (fVar25 < 0.0) {
                fStack_94 = 0.0;
                fStack_90 = 0.0;
                fStack_8c = 0.0;
                local_68 = ZEXT416((uint)fVar31);
                local_78 = (pointer)CONCAT44(0x80000000,fVar29);
                local_98 = fVar20;
                local_7c = fVar35;
                uStack_70 = 0x80000000;
                uStack_6c = 0x80000000;
                fVar25 = sqrtf(fVar25);
                fVar22 = extraout_XMM0_Db_00;
                fVar29 = (float)local_78;
                fVar26 = local_78._4_4_;
                fVar20 = local_98;
                fVar28 = fStack_94;
                fVar27 = fStack_90;
                fVar24 = fStack_8c;
                fVar31 = (float)local_68._0_4_;
                fVar35 = local_7c;
              }
              else {
                fVar25 = SQRT(fVar25);
                fVar22 = (float)local_e8._4_4_;
                fVar26 = -0.0;
                local_b8 = (undefined1  [8])(ulong)(uint)fVar21;
              }
              fVar23 = this->radius_;
              fVar21 = (float)local_b8._0_4_ * fVar25;
              fVar37 = (float)local_b8._4_4_ * fVar22;
              fVar31 = 1.0 / fVar31;
              local_b8._0_4_ = fVar31 * (fVar25 * (float)local_e8._0_4_ + fVar23 * fVar29);
              local_b8._4_4_ = fVar31 * (fVar23 * (float)local_e8._0_4_ + fVar21);
              fStack_b0 = fVar31 * (fVar26 * (float)local_e8._0_4_ + fVar26 * 0.0);
              fStack_ac = fVar31 * (fVar22 * (float)local_e8._0_4_ + fVar37);
            }
            else {
              fStack_b0 = -0.0;
              fStack_ac = -0.0;
              local_b8._0_4_ = -(pOVar18->unitDir_).x_;
              local_b8._4_4_ = -(pOVar18->unitDir_).y_;
            }
            if (pOVar14->isConvex_ == true) {
              fVar35 = fVar20 - fVar35;
              if (fVar35 < 0.0) {
                local_98 = fVar20;
                fStack_94 = fVar28;
                fStack_90 = fVar27;
                fStack_8c = fVar24;
                fVar35 = sqrtf(fVar35);
                fVar20 = local_98;
              }
              else {
                fVar35 = SQRT(fVar35);
              }
              fVar23 = this->radius_;
              fVar29 = (1.0 / fVar20) * (fVar35 * (float)local_c8 + (float)local_d8._0_4_ * fVar23);
              fVar31 = (1.0 / fVar20) * (fVar23 * -(float)local_c8 + (float)local_d8._0_4_ * fVar35)
              ;
            }
            else {
              fVar29 = (pOVar18->unitDir_).x_;
              fVar31 = (pOVar18->unitDir_).y_;
            }
          }
          else {
            if (pOVar14->isConvex_ != true) goto LAB_00107e0b;
            fVar35 = fVar20 - fVar35;
            if (fVar35 < 0.0) {
              fStack_94 = 0.0;
              fStack_90 = 0.0;
              fStack_8c = 0.0;
              local_98 = fVar20;
              fVar35 = sqrtf(fVar35);
              fVar29 = extraout_XMM0_Db_01;
              fVar20 = local_98;
            }
            else {
              fVar35 = SQRT(fVar35);
              fVar29 = fStack_c4;
            }
            fVar23 = this->radius_;
            fVar20 = 1.0 / fVar20;
            local_b8._0_4_ = (-(float)local_d8._0_4_ * fVar23 + fVar35 * (float)local_c8) * fVar20;
            local_b8._4_4_ = ((float)local_d8._0_4_ * fVar35 + fVar23 * (float)local_c8) * fVar20;
            fStack_b0 = ((float)local_d8._0_4_ * 0.0 + fVar29 * (float)local_c8) * fVar20;
            fStack_ac = ((float)local_d8._0_4_ * fVar29 + (float)local_c8 * 0.0) * fVar20;
            fVar29 = (fVar35 * (float)local_c8 + (float)local_d8._0_4_ * fVar23) * fVar20;
            fVar31 = (fVar23 * -(float)local_c8 + (float)local_d8._0_4_ * fVar35) * fVar20;
            pOVar18 = pOVar14;
          }
        }
        else {
          if (pOVar18->isConvex_ != true) goto LAB_00107e0b;
          fVar35 = fVar31 - fVar35;
          if (fVar35 < 0.0) {
            local_68 = ZEXT416((uint)fVar31);
            local_78 = (pointer)CONCAT44(0x80000000,fVar29);
            local_d8._4_4_ = 0x80000000;
            fStack_d0 = -0.0;
            fStack_cc = -0.0;
            uStack_70 = 0x80000000;
            uStack_6c = 0x80000000;
            fVar35 = sqrtf(fVar35);
            fVar28 = extraout_XMM0_Db;
            fVar29 = (float)local_78;
            fVar31 = (float)local_68._0_4_;
          }
          else {
            fVar35 = SQRT(fVar35);
            fVar28 = (float)local_e8._4_4_;
          }
          fVar23 = this->radius_;
          fVar31 = 1.0 / fVar31;
          fVar27 = (float)local_b8._0_4_ * fVar23;
          fVar24 = (float)local_b8._0_4_ * fVar35;
          fVar25 = (float)local_b8._0_4_ * 0.0;
          fVar22 = (float)local_b8._0_4_ * fVar28;
          local_b8._0_4_ = (fVar23 * fVar29 + fVar35 * (float)local_e8._0_4_) * fVar31;
          local_b8._4_4_ = (fVar24 + fVar23 * (float)local_e8._0_4_) * fVar31;
          fStack_b0 = (fVar25 + fVar28 * (float)local_e8._0_4_) * fVar31;
          fStack_ac = (fVar22 + (float)local_e8._0_4_ * 0.0) * fVar31;
          fVar29 = (fVar35 * (float)local_e8._0_4_ + fVar27) * fVar31;
          fVar31 = (fVar23 * (float)local_d8._0_4_ + fVar24) * fVar31;
          pOVar14 = pOVar18;
        }
        if (pOVar18->isConvex_ == true) {
          fVar28 = (pOVar18->prevObstacle_->unitDir_).x_;
          fVar27 = (pOVar18->prevObstacle_->unitDir_).y_;
          if (0.0 <= (float)local_b8._4_4_ * fVar28 - (float)local_b8._0_4_ * fVar27) {
            fStack_b0 = -0.0;
            local_b8._4_4_ = -fVar27;
            local_b8._0_4_ = -fVar28;
            bVar8 = true;
            fStack_ac = fStack_b0;
          }
          else {
            bVar8 = false;
          }
        }
        else {
          bVar8 = false;
        }
        if ((pOVar14->isConvex_ != true) ||
           (0.0 < (pOVar14->unitDir_).y_ * fVar29 - fVar31 * (pOVar14->unitDir_).x_)) {
          bVar7 = false;
        }
        else {
          fVar29 = (pOVar14->unitDir_).x_;
          fVar31 = (pOVar14->unitDir_).y_;
          bVar7 = true;
        }
        fVar24 = (this->position_).x_;
        fVar25 = (this->position_).y_;
        VVar2 = this->velocity_;
        fVar22 = VVar2.x_;
        fVar35 = VVar2.y_;
        fVar28 = ((pOVar18->point_).x_ - fVar24) * local_58;
        fVar27 = ((pOVar18->point_).y_ - fVar25) * fStack_54;
        fVar24 = ((pOVar14->point_).x_ - fVar24) * local_58;
        local_d8._4_4_ = ((pOVar14->point_).y_ - fVar25) * fStack_54;
        fVar20 = fVar24 - fVar28;
        local_d8._0_4_ = local_d8._4_4_;
        fStack_d0 = (float)local_d8._4_4_;
        fStack_cc = (float)local_d8._4_4_;
        fVar21 = (float)local_d8._4_4_ - fVar27;
        local_e8._8_8_ = 0;
        local_e8._0_4_ = VVar2.x_;
        local_e8._4_4_ = VVar2.y_;
        fVar25 = fVar22 - fVar28;
        fVar26 = fVar35 - fVar27;
        fVar37 = 0.5;
        if (pOVar18 != pOVar14) {
          fVar37 = (fVar25 * fVar20 + fVar21 * fVar26) / (fVar20 * fVar20 + fVar21 * fVar21);
        }
        fVar36 = fVar25 * (float)local_b8._0_4_ + (float)local_b8._4_4_ * fVar26;
        if ((fVar37 < 0.0) && (fVar36 < 0.0)) {
LAB_00107bb5:
          fVar29 = 1.0 / SQRT(fVar25 * fVar25 + fVar26 * fVar26);
          fVar25 = fVar29 * fVar25;
          fVar29 = fVar29 * fVar26;
          local_f8.direction = (Vector2)(CONCAT44(fVar25,fVar29) ^ 0x8000000000000000);
          local_f8.point.y_ = fVar27 + fVar23 * (float)local_a8._0_4_ * fVar29;
          local_f8.point.x_ = fVar28 + fVar23 * (float)local_a8._0_4_ * fVar25;
LAB_00107c12:
          iVar15._M_current =
               (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_finish;
          goto LAB_00107c16;
        }
        fVar33 = fVar22 - fVar24;
        fVar34 = fVar35 - (float)local_d8._4_4_;
        fStack_c4 = fVar31;
        local_c8 = (undefined1  [4])fVar31;
        fStack_c0 = fVar31;
        fStack_bc = fVar31;
        fVar30 = fVar33 * fVar29 + fVar31 * fVar34;
        if ((fVar30 < 0.0) && ((pOVar18 == pOVar14 && (fVar36 < 0.0)))) goto LAB_00107bb5;
        if ((1.0 < fVar37) && (fVar30 < 0.0)) {
          fVar29 = 1.0 / SQRT(fVar33 * fVar33 + fVar34 * fVar34);
          fVar33 = fVar29 * fVar33;
          fVar29 = fVar29 * fVar34;
          local_f8.direction = (Vector2)(CONCAT44(fVar33,fVar29) ^ 0x8000000000000000);
          local_f8.point.y_ = (float)local_d8._4_4_ + fVar23 * (float)local_a8._0_4_ * fVar29;
          local_f8.point.x_ = fVar24 + fVar23 * (float)local_a8._0_4_ * fVar33;
          goto LAB_00107c12;
        }
        fVar25 = INFINITY;
        if (((pOVar18 != pOVar14) && (fVar25 = INFINITY, 0.0 <= fVar37)) &&
           (fVar25 = INFINITY, fVar37 <= 1.0)) {
          fVar20 = fVar22 - (fVar20 * fVar37 + fVar28);
          fVar25 = fVar35 - (fVar21 * fVar37 + fVar27);
          fVar25 = fVar20 * fVar20 + fVar25 * fVar25;
        }
        fVar20 = INFINITY;
        if (0.0 <= fVar36) {
          fVar21 = fVar22 - ((float)local_b8._0_4_ * fVar36 + fVar28);
          fVar20 = fVar35 - (fVar27 + (float)local_b8._4_4_ * fVar36);
          fVar20 = fVar21 * fVar21 + fVar20 * fVar20;
        }
        fVar21 = INFINITY;
        if (0.0 <= fVar30) {
          fVar22 = fVar22 - (fVar29 * fVar30 + fVar24);
          fVar35 = fVar35 - (fVar31 * fVar30 + (float)local_d8._4_4_);
          fVar21 = fVar22 * fVar22 + fVar35 * fVar35;
        }
        auVar4 = local_e8;
        auVar5 = _local_d8;
        auVar6 = _local_c8;
        if ((fVar25 <= fVar20) && (fVar25 <= fVar21)) {
          local_f8.direction = pOVar18->unitDir_;
          local_f8.point.y_ = fVar27 - local_f8.direction.x_ * fVar23 * (float)local_a8._0_4_;
          local_f8.point.x_ = fVar28 + local_f8.direction.y_ * fVar23 * (float)local_a8._0_4_;
          local_f8.direction = (Vector2)((ulong)local_f8.direction ^ 0x8000000080000000);
          iVar15._M_current =
               (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar15._M_current !=
              (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            (iVar15._M_current)->point = local_f8.point;
            (iVar15._M_current)->direction = local_f8.direction;
            ppLVar1 = &(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppLVar1 = *ppLVar1 + 1;
            goto LAB_00107e0b;
          }
          goto LAB_00107df7;
        }
        if (fVar20 <= fVar21) {
          if (bVar8) goto LAB_00107e0b;
          local_f8.point.y_ = (float)local_b8._0_4_ * fVar23 * (float)local_a8._0_4_ + fVar27;
          local_f8.point.x_ = fVar28 - (float)local_b8._4_4_ * fVar23 * (float)local_a8._0_4_;
          local_f8.direction.x_ = (float)local_b8._0_4_;
          local_f8.direction.y_ = (float)local_b8._4_4_;
          goto LAB_00107c12;
        }
        if (!bVar7) {
          local_f8.point.y_ = (float)local_d8._4_4_ - fVar29 * fVar23 * (float)local_a8._0_4_;
          local_f8.point.x_ = fVar24 + fVar31 * fVar23 * (float)local_a8._0_4_;
          local_f8.direction = (Vector2)(CONCAT44(fVar31,fVar29) ^ 0x8000000080000000);
          goto LAB_00107c12;
        }
      }
      else {
        if (pOVar18->isConvex_ != true) goto LAB_00107e0b;
        local_f8.direction.y_ = fVar20 * (1.0 / SQRT(fVar31));
        local_f8.direction.x_ = fVar29 * (1.0 / SQRT(fVar31));
LAB_00107c16:
        if (iVar15._M_current ==
            (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
LAB_00107df7:
          std::vector<RVO::Line,std::allocator<RVO::Line>>::_M_realloc_insert<RVO::Line_const&>
                    ((vector<RVO::Line,std::allocator<RVO::Line>> *)this_00,iVar15,&local_f8);
          auVar4 = local_e8;
          auVar5 = _local_d8;
          auVar6 = _local_c8;
        }
        else {
          (iVar15._M_current)->point = local_f8.point;
          (iVar15._M_current)->direction = local_f8.direction;
          ppLVar1 = &(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
          auVar4 = local_e8;
          auVar5 = _local_d8;
          auVar6 = _local_c8;
        }
      }
LAB_00107e0b:
      _local_c8 = auVar6;
      _local_d8 = auVar5;
      local_e8 = auVar4;
      ppVar9 = (this->obstacleNeighbors_).
               super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar11 = (this->obstacleNeighbors_).
                super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
LAB_00107e13:
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)ppVar11 - (long)ppVar9 >> 4));
    pLVar19 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
              super__Vector_impl_data._M_start;
    pLVar13 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppVar10 = (this->agentNeighbors_).
            super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_78 = pLVar13;
  if ((this->agentNeighbors_).
      super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar10) {
    local_48 = 1.0 / this->timeHorizon_;
    local_68 = ZEXT416((uint)local_48);
    lVar16 = 8;
    uVar17 = 0;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    do {
      lVar3 = *(long *)((long)&ppVar10->first + lVar16);
      fVar23 = (this->velocity_).x_;
      fVar20 = (this->velocity_).y_;
      fVar24 = (float)*(undefined8 *)(lVar3 + 0x60) - (this->position_).x_;
      fVar25 = (float)((ulong)*(undefined8 *)(lVar3 + 0x60) >> 0x20) - (this->position_).y_;
      fVar28 = fVar23 - (float)*(undefined8 *)(lVar3 + 0x88);
      fVar27 = fVar20 - (float)((ulong)*(undefined8 *)(lVar3 + 0x88) >> 0x20);
      auVar32 = (undefined1  [4])(fVar24 * fVar24 + fVar25 * fVar25);
      fVar29 = this->radius_ + *(float *)(lVar3 + 0x70);
      fVar22 = fVar29 * fVar29;
      local_f8.direction.x_ = 0.0;
      local_f8.direction.y_ = 0.0;
      if ((float)auVar32 <= fVar22) {
        fVar22 = 1.0 / this->sim_->timeStep_;
        fVar28 = fVar28 - fVar24 * fVar22;
        fVar27 = fVar27 - fVar25 * fVar22;
        fVar31 = SQRT(fVar28 * fVar28 + fVar27 * fVar27);
        fVar24 = 1.0 / fVar31;
        fVar28 = fVar24 * fVar28;
        fVar24 = fVar24 * fVar27;
        fVar31 = fVar29 * fVar22 - fVar31;
        fVar21 = fVar31 * fVar28;
        fVar31 = fVar31 * fVar24;
        local_f8.direction = (Vector2)(CONCAT44(fVar28,fVar24) ^ 0x8000000000000000);
      }
      else {
        fVar21 = fVar28 - local_48 * fVar24;
        fVar35 = fVar27 - fStack_44 * fVar25;
        fVar26 = fVar21 * fVar24 + fVar25 * fVar35;
        if ((0.0 <= fVar26) ||
           (fVar31 = fVar21 * fVar21 + fVar35 * fVar35, fVar26 * fVar26 <= fVar22 * fVar31)) {
          fVar22 = (float)auVar32 - fVar22;
          if (fVar22 < 0.0) {
            local_e8 = ZEXT416((uint)fVar29);
            local_b8._4_4_ = fVar27;
            local_b8._0_4_ = fVar28;
            _fStack_b0 = 0;
            local_d8._4_4_ = fVar25;
            local_d8._0_4_ = fVar24;
            _fStack_d0 = 0;
            fStack_c4 = fVar25;
            local_c8 = auVar32;
            _fStack_c0 = 0;
            local_a8._4_4_ = fVar25;
            local_a8._0_4_ = fVar25;
            fStack_a0 = fVar25;
            fStack_9c = fVar25;
            local_98 = fVar35;
            fStack_94 = fVar35;
            fStack_90 = fVar35;
            fStack_8c = fVar35;
            local_58 = fVar21;
            fStack_54 = fVar35;
            fStack_50 = 0.0 - fStack_40 * 0.0;
            fStack_4c = 0.0 - fStack_3c * 0.0;
            fVar22 = sqrtf(fVar22);
            fVar29 = (float)local_e8._0_4_;
            fVar28 = (float)local_b8._0_4_;
            fVar27 = (float)local_b8._4_4_;
            fVar24 = (float)local_d8._0_4_;
            fVar25 = (float)local_d8._4_4_;
            auVar32 = local_c8;
            fVar23 = (float)local_a8._0_4_;
            fVar20 = (float)local_a8._4_4_;
            fVar21 = local_58;
            fVar35 = local_98;
          }
          else {
            fVar22 = SQRT(fVar22);
            fVar23 = fVar25;
            fVar20 = fVar25;
          }
          if (fVar35 * fVar24 - fVar21 * fVar23 <= 0.0) {
            fVar25 = -(fVar29 * -fVar24 + fVar23 * fVar22);
            fVar29 = -(fVar22 * fVar24 + fVar20 * fVar29);
          }
          else {
            fVar25 = fVar24 * fVar29 + fVar22 * fVar25;
            fVar29 = fVar24 * fVar22 + -fVar23 * fVar29;
          }
          fVar25 = (1.0 / (float)auVar32) * fVar25;
          fVar29 = (1.0 / (float)auVar32) * fVar29;
          local_f8.direction.y_ = fVar25;
          local_f8.direction.x_ = fVar29;
          fVar24 = fVar29 * fVar28 + fVar27 * fVar25;
          fVar21 = fVar24 * fVar29 - fVar28;
          fVar31 = fVar24 * fVar25 - fVar27;
          fVar23 = (this->velocity_).x_;
          fVar20 = (this->velocity_).y_;
        }
        else {
          fVar31 = SQRT(fVar31);
          fVar28 = 1.0 / fVar31;
          fVar31 = fVar29 * (float)local_68._0_4_ - fVar31;
          fVar21 = fVar21 * fVar28;
          fVar35 = fVar35 * fVar28;
          local_f8.direction = (Vector2)(CONCAT44(fVar21,fVar35) ^ 0x8000000000000000);
          fVar21 = fVar31 * fVar21;
          fVar31 = fVar31 * fVar35;
        }
      }
      local_f8.point.y_ = fVar31 * 0.5 + fVar20;
      local_f8.point.x_ = fVar21 * 0.5 + fVar23;
      iVar15._M_current =
           (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<RVO::Line,std::allocator<RVO::Line>>::_M_realloc_insert<RVO::Line_const&>
                  ((vector<RVO::Line,std::allocator<RVO::Line>> *)this_00,iVar15,&local_f8);
      }
      else {
        (iVar15._M_current)->point = local_f8.point;
        (iVar15._M_current)->direction = local_f8.direction;
        ppLVar1 = &(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + 1;
      }
      uVar17 = uVar17 + 1;
      ppVar10 = (this->agentNeighbors_).
                super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x10;
    } while (uVar17 < (ulong)((long)(this->agentNeighbors_).
                                    super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 4)
            );
  }
  beginLine = linearProgram2(this_00,this->maxSpeed_,&this->prefVelocity_,false,&this->newVelocity_)
  ;
  if (beginLine <
      (ulong)((long)(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    linearProgram3(this_00,(long)local_78 - (long)pLVar19 >> 4,beginLine,this->maxSpeed_,
                   &this->newVelocity_);
  }
  return;
}

Assistant:

void Agent::computeNewVelocity()
	{
		orcaLines_.clear();

		const float invTimeHorizonObst = 1.0f / timeHorizonObst_;

		/* Create obstacle ORCA lines. */
		for (size_t i = 0; i < obstacleNeighbors_.size(); ++i) {

			const Obstacle *obstacle1 = obstacleNeighbors_[i].second;
			const Obstacle *obstacle2 = obstacle1->nextObstacle_;

			const Vector2 relativePosition1 = obstacle1->point_ - position_;
			const Vector2 relativePosition2 = obstacle2->point_ - position_;

			/*
			 * Check if velocity obstacle of obstacle is already taken care of by
			 * previously constructed obstacle ORCA lines.
			 */
			bool alreadyCovered = false;

			for (size_t j = 0; j < orcaLines_.size(); ++j) {
				if (det(invTimeHorizonObst * relativePosition1 - orcaLines_[j].point, orcaLines_[j].direction) - invTimeHorizonObst * radius_ >= -RVO_EPSILON && det(invTimeHorizonObst * relativePosition2 - orcaLines_[j].point, orcaLines_[j].direction) - invTimeHorizonObst * radius_ >=  -RVO_EPSILON) {
					alreadyCovered = true;
					break;
				}
			}

			if (alreadyCovered) {
				continue;
			}

			/* Not yet covered. Check for collisions. */

			const float distSq1 = absSq(relativePosition1);
			const float distSq2 = absSq(relativePosition2);

			const float radiusSq = sqr(radius_);

			const Vector2 obstacleVector = obstacle2->point_ - obstacle1->point_;
			const float s = (-relativePosition1 * obstacleVector) / absSq(obstacleVector);
			const float distSqLine = absSq(-relativePosition1 - s * obstacleVector);

			Line line;

			if (s < 0.0f && distSq1 <= radiusSq) {
				/* Collision with left vertex. Ignore if non-convex. */
				if (obstacle1->isConvex_) {
					line.point = Vector2(0.0f, 0.0f);
					line.direction = normalize(Vector2(-relativePosition1.y(), relativePosition1.x()));
					orcaLines_.push_back(line);
				}

				continue;
			}
			else if (s > 1.0f && distSq2 <= radiusSq) {
				/* Collision with right vertex. Ignore if non-convex
				 * or if it will be taken care of by neighoring obstace */
				if (obstacle2->isConvex_ && det(relativePosition2, obstacle2->unitDir_) >= 0.0f) {
					line.point = Vector2(0.0f, 0.0f);
					line.direction = normalize(Vector2(-relativePosition2.y(), relativePosition2.x()));
					orcaLines_.push_back(line);
				}

				continue;
			}
			else if (s >= 0.0f && s < 1.0f && distSqLine <= radiusSq) {
				/* Collision with obstacle segment. */
				line.point = Vector2(0.0f, 0.0f);
				line.direction = -obstacle1->unitDir_;
				orcaLines_.push_back(line);
				continue;
			}

			/*
			 * No collision.
			 * Compute legs. When obliquely viewed, both legs can come from a single
			 * vertex. Legs extend cut-off line when nonconvex vertex.
			 */

			Vector2 leftLegDirection, rightLegDirection;

			if (s < 0.0f && distSqLine <= radiusSq) {
				/*
				 * Obstacle viewed obliquely so that left vertex
				 * defines velocity obstacle.
				 */
				if (!obstacle1->isConvex_) {
					/* Ignore obstacle. */
					continue;
				}

				obstacle2 = obstacle1;

				const float leg1 = std::sqrt(distSq1 - radiusSq);
				leftLegDirection = Vector2(relativePosition1.x() * leg1 - relativePosition1.y() * radius_, relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
				rightLegDirection = Vector2(relativePosition1.x() * leg1 + relativePosition1.y() * radius_, -relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
			}
			else if (s > 1.0f && distSqLine <= radiusSq) {
				/*
				 * Obstacle viewed obliquely so that
				 * right vertex defines velocity obstacle.
				 */
				if (!obstacle2->isConvex_) {
					/* Ignore obstacle. */
					continue;
				}

				obstacle1 = obstacle2;

				const float leg2 = std::sqrt(distSq2 - radiusSq);
				leftLegDirection = Vector2(relativePosition2.x() * leg2 - relativePosition2.y() * radius_, relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
				rightLegDirection = Vector2(relativePosition2.x() * leg2 + relativePosition2.y() * radius_, -relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
			}
			else {
				/* Usual situation. */
				if (obstacle1->isConvex_) {
					const float leg1 = std::sqrt(distSq1 - radiusSq);
					leftLegDirection = Vector2(relativePosition1.x() * leg1 - relativePosition1.y() * radius_, relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
				}
				else {
					/* Left vertex non-convex; left leg extends cut-off line. */
					leftLegDirection = -obstacle1->unitDir_;
				}

				if (obstacle2->isConvex_) {
					const float leg2 = std::sqrt(distSq2 - radiusSq);
					rightLegDirection = Vector2(relativePosition2.x() * leg2 + relativePosition2.y() * radius_, -relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
				}
				else {
					/* Right vertex non-convex; right leg extends cut-off line. */
					rightLegDirection = obstacle1->unitDir_;
				}
			}

			/*
			 * Legs can never point into neighboring edge when convex vertex,
			 * take cutoff-line of neighboring edge instead. If velocity projected on
			 * "foreign" leg, no constraint is added.
			 */

			const Obstacle *const leftNeighbor = obstacle1->prevObstacle_;

			bool isLeftLegForeign = false;
			bool isRightLegForeign = false;

			if (obstacle1->isConvex_ && det(leftLegDirection, -leftNeighbor->unitDir_) >= 0.0f) {
				/* Left leg points into obstacle. */
				leftLegDirection = -leftNeighbor->unitDir_;
				isLeftLegForeign = true;
			}

			if (obstacle2->isConvex_ && det(rightLegDirection, obstacle2->unitDir_) <= 0.0f) {
				/* Right leg points into obstacle. */
				rightLegDirection = obstacle2->unitDir_;
				isRightLegForeign = true;
			}

			/* Compute cut-off centers. */
			const Vector2 leftCutoff = invTimeHorizonObst * (obstacle1->point_ - position_);
			const Vector2 rightCutoff = invTimeHorizonObst * (obstacle2->point_ - position_);
			const Vector2 cutoffVec = rightCutoff - leftCutoff;

			/* Project current velocity on velocity obstacle. */

			/* Check if current velocity is projected on cutoff circles. */
			const float t = (obstacle1 == obstacle2 ? 0.5f : ((velocity_ - leftCutoff) * cutoffVec) / absSq(cutoffVec));
			const float tLeft = ((velocity_ - leftCutoff) * leftLegDirection);
			const float tRight = ((velocity_ - rightCutoff) * rightLegDirection);

			if ((t < 0.0f && tLeft < 0.0f) || (obstacle1 == obstacle2 && tLeft < 0.0f && tRight < 0.0f)) {
				/* Project on left cut-off circle. */
				const Vector2 unitW = normalize(velocity_ - leftCutoff);

				line.direction = Vector2(unitW.y(), -unitW.x());
				line.point = leftCutoff + radius_ * invTimeHorizonObst * unitW;
				orcaLines_.push_back(line);
				continue;
			}
			else if (t > 1.0f && tRight < 0.0f) {
				/* Project on right cut-off circle. */
				const Vector2 unitW = normalize(velocity_ - rightCutoff);

				line.direction = Vector2(unitW.y(), -unitW.x());
				line.point = rightCutoff + radius_ * invTimeHorizonObst * unitW;
				orcaLines_.push_back(line);
				continue;
			}

			/*
			 * Project on left leg, right leg, or cut-off line, whichever is closest
			 * to velocity.
			 */
			const float distSqCutoff = ((t < 0.0f || t > 1.0f || obstacle1 == obstacle2) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (leftCutoff + t * cutoffVec)));
			const float distSqLeft = ((tLeft < 0.0f) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (leftCutoff + tLeft * leftLegDirection)));
			const float distSqRight = ((tRight < 0.0f) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (rightCutoff + tRight * rightLegDirection)));

			if (distSqCutoff <= distSqLeft && distSqCutoff <= distSqRight) {
				/* Project on cut-off line. */
				line.direction = -obstacle1->unitDir_;
				line.point = leftCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
			else if (distSqLeft <= distSqRight) {
				/* Project on left leg. */
				if (isLeftLegForeign) {
					continue;
				}

				line.direction = leftLegDirection;
				line.point = leftCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
			else {
				/* Project on right leg. */
				if (isRightLegForeign) {
					continue;
				}

				line.direction = -rightLegDirection;
				line.point = rightCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
		}

		const size_t numObstLines = orcaLines_.size();

		const float invTimeHorizon = 1.0f / timeHorizon_;

		/* Create agent ORCA lines. */
		for (size_t i = 0; i < agentNeighbors_.size(); ++i) {
			const Agent *const other = agentNeighbors_[i].second;

			const Vector2 relativePosition = other->position_ - position_;
			const Vector2 relativeVelocity = velocity_ - other->velocity_;
			const float distSq = absSq(relativePosition);
			const float combinedRadius = radius_ + other->radius_;
			const float combinedRadiusSq = sqr(combinedRadius);

			Line line;
			Vector2 u;

			if (distSq > combinedRadiusSq) {
				/* No collision. */
				const Vector2 w = relativeVelocity - invTimeHorizon * relativePosition;
				/* Vector from cutoff center to relative velocity. */
				const float wLengthSq = absSq(w);

				const float dotProduct1 = w * relativePosition;

				if (dotProduct1 < 0.0f && sqr(dotProduct1) > combinedRadiusSq * wLengthSq) {
					/* Project on cut-off circle. */
					const float wLength = std::sqrt(wLengthSq);
					const Vector2 unitW = w / wLength;

					line.direction = Vector2(unitW.y(), -unitW.x());
					u = (combinedRadius * invTimeHorizon - wLength) * unitW;
				}
				else {
					/* Project on legs. */
					const float leg = std::sqrt(distSq - combinedRadiusSq);

					if (det(relativePosition, w) > 0.0f) {
						/* Project on left leg. */
						line.direction = Vector2(relativePosition.x() * leg - relativePosition.y() * combinedRadius, relativePosition.x() * combinedRadius + relativePosition.y() * leg) / distSq;
					}
					else {
						/* Project on right leg. */
						line.direction = -Vector2(relativePosition.x() * leg + relativePosition.y() * combinedRadius, -relativePosition.x() * combinedRadius + relativePosition.y() * leg) / distSq;
					}

					const float dotProduct2 = relativeVelocity * line.direction;

					u = dotProduct2 * line.direction - relativeVelocity;
				}
			}
			else {
				/* Collision. Project on cut-off circle of time timeStep. */
				const float invTimeStep = 1.0f / sim_->timeStep_;

				/* Vector from cutoff center to relative velocity. */
				const Vector2 w = relativeVelocity - invTimeStep * relativePosition;

				const float wLength = abs(w);
				const Vector2 unitW = w / wLength;

				line.direction = Vector2(unitW.y(), -unitW.x());
				u = (combinedRadius * invTimeStep - wLength) * unitW;
			}

			line.point = velocity_ + 0.5f * u;
			orcaLines_.push_back(line);
		}

		size_t lineFail = linearProgram2(orcaLines_, maxSpeed_, prefVelocity_, false, newVelocity_);

		if (lineFail < orcaLines_.size()) {
			linearProgram3(orcaLines_, numObstLines, lineFail, maxSpeed_, newVelocity_);
		}
	}